

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void diligent_spirv_cross::inner::
     join_helper<char_const(&)[8],std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
               (StringStream<4096UL,_4096UL> *stream,char (*t) [8],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               char (*ts_1) [44],uint *ts_2,char (*ts_3) [10],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4)

{
  StringStream<4096UL,_4096UL>::operator<<(stream,*t);
  join_helper<std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
            (stream,ts,ts_1,ts_2,ts_3,ts_4);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}